

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O2

ConditionalPredicateSyntax * __thiscall
slang::parsing::Parser::parseConditionalPredicate
          (Parser *this,ExpressionSyntax *first,TokenKind endKind,Token *end)

{
  bool bVar1;
  int iVar2;
  PatternSyntax *pattern;
  MatchesClauseSyntax *matchesClause;
  SourceLocation location;
  undefined4 extraout_var;
  ConditionalPredicateSyntax *pCVar3;
  ConditionalPatternSyntax *pCVar4;
  Info *src;
  Info *extraout_RDX;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *conditions;
  TokenKind TVar5;
  ulong uVar6;
  Token TVar7;
  Token TVar8;
  Token local_f8;
  SyntaxFactory *local_e8;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_e0;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_b8;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> buffer;
  
  local_e0._M_first._M_storage.info = (Info *)local_e0._M_rest;
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.data_ =
       (pointer)buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement;
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.len = 0;
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.cap = 4;
  bVar1 = ParserBase::peek(&this->super_ParserBase,MatchesKeyword);
  if (bVar1) {
    TVar7 = ParserBase::consume(&this->super_ParserBase);
    pattern = parsePattern(this);
    matchesClause = slang::syntax::SyntaxFactory::matchesClause(&this->factory,TVar7,pattern);
  }
  else {
    matchesClause = (MatchesClauseSyntax *)0x0;
  }
  local_e8 = &this->factory;
  local_e0._M_rest =
       (_Variadic_union<const_slang::syntax::SyntaxNode_*>)
       slang::syntax::SyntaxFactory::conditionalPattern(local_e8,first,matchesClause);
  local_d0._0_1_ = 1;
  SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
            (&buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
             (TokenOrSyntax *)&local_e0._M_first);
  bVar1 = ParserBase::peek(&this->super_ParserBase,TripleAnd);
  if (bVar1) {
    local_e0._M_first._M_storage =
         (_Uninitialized<slang::parsing::Token,_true>)ParserBase::consume(&this->super_ParserBase);
    local_d0._0_1_ = 0;
    SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
              (&buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
               (TokenOrSyntax *)&local_e0._M_first);
    TVar7 = ParserBase::peek(&this->super_ParserBase);
    local_f8 = TVar7;
    bVar1 = slang::syntax::SyntaxFacts::isEndOfConditionalPredicate(TVar7.kind);
    if (bVar1) {
      bVar1 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
      if (!bVar1) {
        location = Token::location(&local_f8);
        ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x340005,location);
      }
    }
    else {
      bVar1 = slang::syntax::SyntaxFacts::isPossibleExpressionOrTripleAnd(TVar7.kind);
      if (!bVar1) {
        ParserBase::reportMissingList(&this->super_ParserBase,TVar7,endKind,end,(DiagCode)0x340005);
        src = extraout_RDX;
        goto LAB_002c26b6;
      }
      while( true ) {
        pCVar4 = parseConditionalPattern(this);
        local_e0._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pCVar4;
        local_d0._0_1_ = 1;
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  (&buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                   (TokenOrSyntax *)&local_e0._M_first);
        TVar8 = ParserBase::peek(&this->super_ParserBase);
        TVar5 = TVar8.kind;
        bVar1 = slang::syntax::SyntaxFacts::isEndOfConditionalPredicate(TVar5);
        if (TVar5 == EndOfFile || bVar1) break;
        if (TVar5 != TripleAnd) {
          if (endKind == Semicolon) break;
          ParserBase::expect(&this->super_ParserBase,TripleAnd);
          do {
            bVar1 = ParserBase::
                    skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleExpressionOrTripleAnd,&slang::syntax::SyntaxFacts::isEndOfConditionalPredicate>
                              (&this->super_ParserBase,(DiagCode)0x340005,false);
            if (!bVar1) goto LAB_002c2690;
            bVar1 = ParserBase::peek(&this->super_ParserBase,TripleAnd);
          } while (!bVar1);
        }
        local_e0._M_first._M_storage =
             (_Uninitialized<slang::parsing::Token,_true>)
             ParserBase::expect(&this->super_ParserBase,TripleAnd);
        local_d0._0_1_ = 0;
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  (&buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                   (TokenOrSyntax *)&local_e0._M_first);
        TVar8 = ParserBase::peek(&this->super_ParserBase);
        TVar5 = TVar8.kind;
        bVar1 = slang::syntax::SyntaxFacts::isEndOfConditionalPredicate(TVar5);
        if (TVar5 == EndOfFile || bVar1) {
          ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
          break;
        }
        if ((TVar7.info == TVar8.info && TVar7.kind == TVar5) &&
           (bVar1 = ParserBase::
                    skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleExpressionOrTripleAnd,&slang::syntax::SyntaxFacts::isEndOfConditionalPredicate>
                              (&this->super_ParserBase,(DiagCode)0x340005,true), !bVar1)) break;
        uVar6 = TVar8._0_8_ & 0xffffffff;
        TVar7.info = TVar8.info;
        TVar7.kind = (short)uVar6;
        TVar7._2_1_ = (char)(uVar6 >> 0x10);
        TVar7.numFlags.raw = (char)(uVar6 >> 0x18);
        TVar7.rawLen = (int)(uVar6 >> 0x20);
        local_f8 = TVar8;
      }
    }
LAB_002c2690:
    TVar7 = ParserBase::expect(&this->super_ParserBase,endKind);
  }
  else {
    TVar7 = ParserBase::expect(&this->super_ParserBase,endKind);
  }
  src = TVar7.info;
  *end = TVar7;
LAB_002c26b6:
  iVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    (&buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                     (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)src);
  local_b8 = CONCAT44(extraout_var,iVar2);
  conditions = &local_e0;
  local_e0._8_4_ = 3;
  local_d0 = 0;
  uStack_c8 = 0;
  local_e0._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)&PTR_getChild_0057e230;
  pCVar3 = slang::syntax::SyntaxFactory::conditionalPredicate
                     (local_e8,(SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax> *)
                               &conditions->_M_first);
  SmallVectorBase<slang::syntax::TokenOrSyntax>::cleanup
            (&buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
             (EVP_PKEY_CTX *)&conditions->_M_first);
  return pCVar3;
}

Assistant:

ConditionalPredicateSyntax& Parser::parseConditionalPredicate(ExpressionSyntax& first,
                                                              TokenKind endKind, Token& end) {
    SmallVector<TokenOrSyntax, 4> buffer;

    MatchesClauseSyntax* matchesClause = nullptr;
    if (peek(TokenKind::MatchesKeyword)) {
        auto matches = consume();
        matchesClause = &factory.matchesClause(matches, parsePattern());
    }

    buffer.push_back(&factory.conditionalPattern(first, matchesClause));

    if (peek(TokenKind::TripleAnd)) {
        buffer.push_back(consume());
        parseList<isPossibleExpressionOrTripleAnd, isEndOfConditionalPredicate>(
            buffer, endKind, TokenKind::TripleAnd, end, RequireItems::True,
            diag::ExpectedConditionalPattern, [this] { return &parseConditionalPattern(); });
    }
    else {
        end = expect(endKind);
    }

    return factory.conditionalPredicate(buffer.copy(alloc));
}